

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll.c
# Opt level: O0

ll_elem * pred(ll_head *q_head,ll_elem *n)

{
  int iVar1;
  ll_head *plVar2;
  ll_elem *plVar3;
  bool bVar4;
  ll_elem *pp;
  ll_elem *ps;
  ll_elem *p_;
  ll_elem *p;
  ll_elem *q;
  ll_elem *n_local;
  ll_head *q_head_local;
  
  p = &q_head->q;
  q = n;
  n_local = &q_head->q;
  plVar2 = (ll_head *)ptr_clear(&q_head->q);
  if (q_head != plVar2) {
    __assert_fail("q == ptr_clear(q)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x147,
                  "struct ll_elem *pred(struct ll_head *, struct ll_elem *)");
  }
  q = ptr_clear(q);
  if (q == (ll_elem *)0x0) {
    __assert_fail("n != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x149,
                  "struct ll_elem *pred(struct ll_head *, struct ll_elem *)");
  }
  p_ = deref(&q->pred);
  plVar3 = ptr_clear(p_);
  if (plVar3 == (ll_elem *)0x0) {
    q_head_local = (ll_head *)p_;
  }
  else {
    while( true ) {
      plVar3 = ptr_clear(p_);
      if (plVar3 == (ll_elem *)0x0) {
        __assert_fail("ptr_clear(p) != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                      0x155,"struct ll_elem *pred(struct ll_head *, struct ll_elem *)");
      }
      iVar1 = deleted_ptr(p_);
      if (iVar1 == 0) {
        pp = succ((ll_head *)n_local,p_);
        plVar3 = ptr_clear(pp);
        if (plVar3 == (ll_elem *)0x0) {
          __assert_fail("ptr_clear(ps) != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                        0x15f,"struct ll_elem *pred(struct ll_head *, struct ll_elem *)");
        }
        while( true ) {
          plVar3 = ptr_clear(pp);
          bVar4 = false;
          if (plVar3 != q) {
            iVar1 = deleted_ptr(p_);
            bVar4 = iVar1 == 0;
          }
          if (!bVar4) break;
          ps = p_;
          iVar1 = ptr_cas(&q->pred,&ps,pp);
          if (iVar1 == 0) {
            deref_release((ll_head *)n_local,pp,1);
            deref_release((ll_head *)n_local,p_,1);
            p_ = deref(&q->pred);
          }
          else {
            deref_acquire(pp,1);
            ptr_clear_deref(&q->pred);
            deref_release((ll_head *)n_local,p_,2);
            p_ = flag_combine(pp,ps);
          }
          pp = succ((ll_head *)n_local,p_);
        }
        deref_release((ll_head *)n_local,pp,1);
      }
      iVar1 = deleted(p_);
      if (iVar1 == 0) break;
      plVar3 = ptr_clear(p_);
      plVar3 = deref(&plVar3->pred);
      ps = p_;
      iVar1 = ptr_cas(&q->pred,&ps,plVar3);
      if (iVar1 == 0) {
        deref_release((ll_head *)n_local,p_,1);
        deref_release((ll_head *)n_local,plVar3,1);
        p_ = deref(&q->pred);
      }
      else {
        deref_acquire(plVar3,1);
        ptr_clear_deref(&q->pred);
        deref_release((ll_head *)n_local,p_,2);
        p_ = plVar3;
      }
    }
    q_head_local = (ll_head *)flag_combine(p_,(ll_elem *)q->pred);
  }
  return &q_head_local->q;
}

Assistant:

static struct ll_elem*
pred(struct ll_head *q_head, struct ll_elem *n)
{
	struct ll_elem	*q, *p, *p_, *ps, *pp;

	q = &q_head->q;
	assert(q == ptr_clear(q));
	n = ptr_clear(n);
	assert(n != NULL);

	p = deref(&n->pred);
	if (ptr_clear(p) == NULL)
		return p;

	for (;;) {
		/*
		 * Predecessor cannot be null,
		 * since it is on the queue and we have a reference to n,
		 * preventing it from leaving the queue.
		 */
		assert(ptr_clear(p) != NULL);

		/*
		 * Search forward to reach the direct predecessor of
		 * n between p and n.  Note that we cannot search for
		 * a better predecessor when p holds the deletion mark
		 * for n.
		 */
		if (!deleted_ptr(p)) {
			ps = succ(q_head, p);
			assert(ptr_clear(ps) != NULL);
			while (ptr_clear(ps) != n && !deleted_ptr(p)) {
				p_ = p;
				if (ptr_cas(&n->pred, &p_, ps)) {
					/* cas succeeded */
					deref_acquire(ps, 1);
					ptr_clear_deref(&n->pred);
					deref_release(q_head, p, 2);
					p = flag_combine(ps, p_);
				} else {
					/* cas failed */
					deref_release(q_head, ps, 1);
					deref_release(q_head, p, 1);

					/*
					 * Cannot do p = p_, since we do not
					 * have the lock on n->pred at the
					 * moment and thus cannot acquire the
					 * reference counter on p_.
					 */
					p = deref(&n->pred);
				}

				ps = succ(q_head, p);
			}
			deref_release(q_head, ps, 1);
		}

		/*
		 * p is the best predecessor, provided it is not a deleted value.
		 */
		if (!deleted(p))
			break;		/* GUARD */

		/*
		 * Skip to the predecessor of p, since p is deleted.
		 */
		pp = deref(&ptr_clear(p)->pred);
		p_ = p;
		if (ptr_cas(&n->pred, &p_, pp)) {
			/* cas succeeded */
			deref_acquire(pp, 1);
			ptr_clear_deref(&n->pred);
			deref_release(q_head, p, 2);
			p = pp;
		} else {
			/* cas failed */
			deref_release(q_head, p, 1);
			deref_release(q_head, pp, 1);
			p = deref(&n->pred);
		}
	}

	return flag_combine(p, (struct ll_elem*)atomic_load_explicit(&n->pred,
	    memory_order_relaxed));
}